

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_fkhash_trie.hpp
# Opt level: O0

void __thiscall
poplar::
compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::expand_(compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
          *this)

{
  uint64_t uVar1;
  uint64_t uVar2;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *this_00;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *pcVar3;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_RDI;
  pair<unsigned_long,_unsigned_long> pVar4;
  uint64_t cnt;
  uint64_t new_i;
  type_conflict *mod;
  type_conflict *quo;
  uint64_t key;
  uint64_t init_id;
  uint64_t dist;
  uint64_t node_id;
  uint64_t i;
  this_type new_ht;
  uint64_t in_stack_fffffffffffffd98;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_fffffffffffffda0;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_fffffffffffffda8;
  unsigned_long in_stack_fffffffffffffdb0;
  unsigned_long in_stack_fffffffffffffdb8;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *this_01;
  ulong local_188;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_ffffffffffffff08;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_ffffffffffffff10;
  uint32_t in_stack_ffffffffffffff44;
  uint32_t in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff4c;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_ffffffffffffff50;
  size_p2 asStack_28 [2];
  
  capa_bits((compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
             *)0x2271d1);
  size_p2::bits(&in_RDI->symb_size_);
  compact_fkhash_trie(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
                      in_stack_ffffffffffffff44);
  pVar4.second = in_stack_fffffffffffffdb0;
  pVar4.first = in_stack_fffffffffffffdb8;
  for (local_188 = 0; uVar1 = size_p2::size(&in_RDI->capa_size_), local_188 < uVar1;
      local_188 = local_188 + 1) {
    uVar1 = compact_vector::operator[]
                      ((compact_vector *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    uVar2 = size_p2::mask(&in_RDI->capa_size_);
    if (uVar1 != uVar2) {
      uVar1 = get_dsp_(in_stack_fffffffffffffda8,(uint64_t)in_stack_fffffffffffffda0);
      if (local_188 < uVar1) {
        compact_vector::size(&in_RDI->table_);
      }
      this_01 = in_RDI;
      get_quo_(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      size_p2::bits(&in_RDI->capa_size_);
      uVar2 = pVar4.first;
      uVar1 = bijective_hash::split_mix_hasher::hash_inv
                        (&in_stack_fffffffffffffda0->hasher_,in_stack_fffffffffffffd98);
      this_00 = (compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                 *)bijective_hash::split_mix_hasher::hash
                             (&in_stack_fffffffffffffda0->hasher_,in_stack_fffffffffffffd98);
      pVar4 = decompose_(this_00,uVar2);
      std::get<0ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)0x22740a);
      std::get<1ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)0x22741f);
      while( true ) {
        in_stack_fffffffffffffda8 =
             (compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
              *)compact_vector::operator[]
                          ((compact_vector *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        pcVar3 = (compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                  *)size_p2::mask(asStack_28);
        if (in_stack_fffffffffffffda8 == pcVar3) break;
        in_stack_fffffffffffffda0 =
             (compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
              *)right_(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      }
      update_slot_(this_01,uVar1,(uint64_t)this_00,pVar4.first,pVar4.second);
    }
  }
  std::
  swap<poplar::compact_fkhash_trie<90u,4u,poplar::compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>,poplar::standard_hash_table<80u,poplar::hash::vigna_hasher>,poplar::bijective_hash::split_mix_hasher>>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  ~compact_fkhash_trie(in_stack_fffffffffffffda0);
  return;
}

Assistant:

void expand_() {
        this_type new_ht{capa_bits() + 1, symb_size_.bits()};
#ifdef POPLAR_EXTRA_STATS
        new_ht.num_resize_ = num_resize_ + 1;
#endif

        for (uint64_t i = 0; i < capa_size_.size(); ++i) {
            uint64_t node_id = ids_[i];

            if (node_id == capa_size_.mask()) {
                // encounter an empty slot
                continue;
            }

            uint64_t dist = get_dsp_(i);
            uint64_t init_id = dist <= i ? i - dist : table_.size() - (dist - i);
            uint64_t key = hasher_.hash_inv(get_quo_(i) << capa_size_.bits() | init_id);

            auto [quo, mod] = new_ht.decompose_(new_ht.hasher_.hash(key));

            for (uint64_t new_i = mod, cnt = 0;; new_i = new_ht.right_(new_i), ++cnt) {
                if (new_ht.ids_[new_i] == new_ht.capa_size_.mask()) {
                    // encounter an empty slot
                    new_ht.update_slot_(new_i, quo, cnt, node_id);
                    break;
                }
            }
        }

        new_ht.size_ = size_;
        std::swap(*this, new_ht);
    }